

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Srm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  uint fSpeculate;
  uint fDualOut;
  char *pcVar5;
  uint local_6c;
  uint local_68;
  uint local_64;
  char pFileName [10];
  char pFileName2 [10];
  char *local_40;
  
  builtin_strncpy(pFileName,"gsrm.aig",9);
  pFileName[9] = '\0';
  builtin_strncpy(pFileName2,"gsyn.aig",9);
  pFileName2[9] = '\0';
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  fSpeculate = 1;
  local_64 = 0;
  local_6c = 0;
  local_68 = 0;
  fDualOut = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (iVar1 = Extra_UtilGetopt(argc,argv,"Adrsfvh"), iVar1 == 100) {
              fDualOut = fDualOut ^ 1;
            }
            if (iVar1 == -1) {
              if (pAbc->pGia != (Gia_Man_t *)0x0) {
                pcVar4 = "";
                if (fSpeculate == 0) {
                  pcVar4 = "s";
                }
                sprintf(pFileName,"gsrm%s.aig",pcVar4);
                sprintf(pFileName2,"gsyn%s.aig",pcVar4);
                pGVar2 = Gia_ManSpecReduce(pAbc->pGia,fDualOut,local_6c,fSpeculate,local_68,local_64
                                          );
                if (pGVar2 != (Gia_Man_t *)0x0) {
                  pGVar3 = pGVar2;
                  if (fSpeculate != 0) {
                    pGVar3 = Gia_ManSeqStructSweep(pGVar2,1,1,0);
                    Gia_ManStop(pGVar2);
                  }
                  if (local_40 == (char *)0x0) {
                    local_40 = pFileName;
                  }
                  Gia_AigerWrite(pGVar3,local_40,0,0);
                  Abc_Print(1,"Speculatively reduced model was written into file \"%s\".\n",
                            pFileName);
                  Gia_ManPrintStatsShort(pGVar3);
                  Gia_ManStop(pGVar3);
                }
                if (local_6c == 0) {
                  return 0;
                }
                pGVar2 = Gia_ManEquivReduce(pAbc->pGia,1,fDualOut,0,local_64);
                if (pGVar2 == (Gia_Man_t *)0x0) {
                  return 0;
                }
                pGVar3 = Gia_ManSeqStructSweep(pGVar2,1,1,0);
                Gia_ManStop(pGVar2);
                Gia_AigerWrite(pGVar3,pFileName2,0,0);
                Abc_Print(1,"Reduced original network was written into file \"%s\".\n",pFileName2);
                Gia_ManPrintStatsShort(pGVar3);
                Gia_ManStop(pGVar3);
                return 0;
              }
              pcVar4 = "Abc_CommandAbc9Srm(): There is no AIG.\n";
              iVar1 = -1;
              goto LAB_00210566;
            }
            if (iVar1 != 0x76) break;
            local_64 = local_64 ^ 1;
          }
          if (iVar1 != 0x66) break;
          local_68 = local_68 ^ 1;
        }
        if (iVar1 != 0x72) break;
        local_6c = local_6c ^ 1;
      }
      if (iVar1 != 0x73) break;
      fSpeculate = fSpeculate ^ 1;
    }
    if (iVar1 != 0x41) goto LAB_0021048f;
    if (argc <= globalUtilOptind) break;
    local_40 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
  }
  Abc_Print(-1,"Command line switch \"-A\" should be followed by a file name.\n");
LAB_0021048f:
  iVar1 = -2;
  Abc_Print(-2,"usage: &srm [-A file] [-drsfvh]\n");
  Abc_Print(-2,"\t          writes speculatively reduced model into file \"%s\"\n",pFileName);
  Abc_Print(-2,
            "\t-A file : file name for dumping speculative-reduced model [default = \"gsrm.aig\"]\n"
           );
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (fDualOut == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-d      : toggle creating dual-output miter [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_6c == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-r      : toggle writing reduced network for synthesis [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (fSpeculate == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-s      : toggle using speculation at the internal nodes [default = %s]\n",pcVar4)
  ;
  pcVar4 = "yes";
  if (local_68 == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-f      : toggle filtering to remove redundant equivalences [default = %s]\n",
            pcVar4);
  if (local_64 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar4 = "\t-h      : print the command usage\n";
LAB_00210566:
  Abc_Print(iVar1,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Srm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileNameIn = NULL;
    char pFileName[10] = "gsrm.aig", pFileName2[10] = "gsyn.aig";
    Gia_Man_t * pTemp, * pAux;
    int c, fVerbose = 0;
    int fSynthesis = 0;
    int fSpeculate = 1;
    int fSkipSome = 0;
    int fDualOut = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Adrsfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileNameIn = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'r':
            fSynthesis ^= 1;
            break;
        case 's':
            fSpeculate ^= 1;
            break;
        case 'f':
            fSkipSome ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm(): There is no AIG.\n" );
        return 1;
    }
    sprintf(pFileName,  "gsrm%s.aig", fSpeculate? "" : "s" );
    sprintf(pFileName2, "gsyn%s.aig", fSpeculate? "" : "s" );
    pTemp = Gia_ManSpecReduce( pAbc->pGia, fDualOut, fSynthesis, fSpeculate, fSkipSome, fVerbose );
    if ( pTemp )
    {
        if ( fSpeculate )
        {
            pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
            Gia_ManStop( pAux );
        }
        Gia_AigerWrite( pTemp, pFileNameIn ? pFileNameIn : pFileName, 0, 0 );
        Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", pFileName );
        Gia_ManPrintStatsShort( pTemp );
        Gia_ManStop( pTemp );
    }
    if ( fSynthesis )
    {
        pTemp = Gia_ManEquivReduce( pAbc->pGia, 1, fDualOut, 0, fVerbose );
        if ( pTemp )
        {
            pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
            Gia_ManStop( pAux );

            Gia_AigerWrite( pTemp, pFileName2, 0, 0 );
            Abc_Print( 1, "Reduced original network was written into file \"%s\".\n", pFileName2 );
            Gia_ManPrintStatsShort( pTemp );
            Gia_ManStop( pTemp );
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &srm [-A file] [-drsfvh]\n" );
    Abc_Print( -2, "\t          writes speculatively reduced model into file \"%s\"\n", pFileName );
    Abc_Print( -2, "\t-A file : file name for dumping speculative-reduced model [default = \"gsrm.aig\"]\n" );
    Abc_Print( -2, "\t-d      : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle writing reduced network for synthesis [default = %s]\n", fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle using speculation at the internal nodes [default = %s]\n", fSpeculate? "yes": "no" );
    Abc_Print( -2, "\t-f      : toggle filtering to remove redundant equivalences [default = %s]\n", fSkipSome? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}